

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void prvTidyPPrintTree(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  ulong uVar1;
  int iVar2;
  Bool BVar3;
  uint indent_00;
  int iVar4;
  bool bVar5;
  bool bVar6;
  TidyPrintImpl *pprint;
  uint contentIndent;
  Bool classic_2;
  Bool hideend;
  Bool indcont;
  uint indprev;
  Bool classic_1;
  Bool classic;
  Bool xhtml;
  uint spaces;
  Node *last;
  Node *content;
  Node *node_local;
  uint indent_local;
  uint mode_local;
  TidyDocImpl *doc_local;
  
  iVar2 = (int)(doc->config).value[0x26].v;
  uVar1 = (doc->config).value[0x62].v;
  if (node != (Node *)0x0) {
    if (doc->progressCallback != (TidyPPProgress)0x0) {
      (*doc->progressCallback)((TidyDoc)doc,node->line,node->column,(doc->pprint).line + 1);
    }
    if (node->type == TextNode) {
      PPrintText(doc,mode,indent,node);
    }
    else if (node->type == CommentTag) {
      PPrintComment(doc,indent,node);
    }
    else if (node->type == RootNode) {
      for (last = node->content; last != (Node *)0x0; last = last->next) {
        prvTidyPPrintTree(doc,mode,indent,last);
      }
    }
    else if (node->type == DocTypeTag) {
      PPrintDocType(doc,indent,node);
    }
    else if (node->type == ProcInsTag) {
      PPrintPI(doc,indent,node);
    }
    else if (node->type == XmlDecl) {
      PPrintXmlDecl(doc,indent,node);
    }
    else if (node->type == CDATATag) {
      PPrintCDATA(doc,indent,node);
    }
    else if (node->type == SectionTag) {
      PPrintSection(doc,indent,node);
    }
    else if (node->type == AspTag) {
      PPrintAsp(doc,indent,node);
    }
    else if (node->type == JsteTag) {
      PPrintJste(doc,indent,node);
    }
    else if (node->type == PhpTag) {
      PPrintPhp(doc,indent,node);
    }
    else if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
            (node->tag->id != TidyTag_MATHML)) {
      BVar3 = prvTidynodeCMIsEmpty(node);
      if ((BVar3 == no) && ((node->type != StartEndTag || ((int)uVar1 != 0)))) {
        if (node->type == StartEndTag) {
          node->type = StartTag;
        }
        if ((node->tag == (Dict *)0x0) ||
           ((node->tag->parser != prvTidyParsePre &&
            (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) ||
             (node->tag->id != TidyTag_TEXTAREA)))))) {
          if ((((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
              (node->tag->id != TidyTag_STYLE)) &&
             (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) ||
              (node->tag->id != TidyTag_SCRIPT)))) {
            BVar3 = prvTidynodeCMIsInline(node);
            if (BVar3 == no) {
              bVar5 = (int)(doc->config).value[0x25].v != 0;
              iVar4 = (int)(doc->config).value[0x3b].v;
              bVar6 = (int)(doc->config).value[0x57].v == 1;
              if (((bVar6) && (node->parent != (Node *)0x0)) &&
                 ((node->parent->content != node &&
                  (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) ||
                   (node->tag->id != TidyTag_HTML)))))) {
                PFlushLineSmart(doc,indent);
              }
              BVar3 = ShouldIndent(doc,node);
              pprint._4_4_ = indent;
              if (BVar3 != no) {
                pprint._4_4_ = iVar2 + indent;
              }
              PCondFlushLineSmart(doc,indent);
              if (((iVar4 == 0) || (BVar3 = prvTidynodeHasCM(node,0x200000), BVar3 == no)) ||
                 (node->attributes != (AttVal *)0x0)) {
                PPrintTag(doc,mode,indent,node);
                BVar3 = ShouldIndent(doc,node);
                if (BVar3 == no) {
                  BVar3 = prvTidynodeHasCM(node,2);
                  if ((BVar3 != no) ||
                     ((((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) &&
                       (node->tag->id == TidyTag_NOFRAMES)) ||
                      ((BVar3 = prvTidynodeHasCM(node,4), BVar3 != no &&
                       (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) ||
                        (node->tag->id != TidyTag_TITLE)))))))) {
                    PFlushLineSmart(doc,pprint._4_4_);
                  }
                }
                else if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                        ((node->tag->id != TidyTag_LI ||
                         (BVar3 = prvTidynodeIsText(node->content), BVar3 == no)))) {
                  PCondFlushLineSmart(doc,pprint._4_4_);
                }
              }
              else {
                BVar3 = ShouldIndent(doc,node);
                if (BVar3 != no) {
                  pprint._4_4_ = pprint._4_4_ - iVar2;
                }
              }
              _xhtml = (Node *)0x0;
              for (last = node->content; last != (Node *)0x0; last = last->next) {
                if (((_xhtml != (Node *)0x0) && (!bVar5)) &&
                   ((BVar3 = prvTidynodeIsText(_xhtml), BVar3 != no &&
                    ((last->tag != (Dict *)0x0 && (BVar3 = prvTidynodeHasCM(last,0x10), BVar3 == no)
                     ))))) {
                  PFlushLineSmart(doc,pprint._4_4_);
                }
                prvTidyPPrintTree(doc,mode,pprint._4_4_,last);
                _xhtml = last;
              }
              BVar3 = ShouldIndent(doc,node);
              if ((BVar3 == no) &&
                 ((iVar4 != 0 ||
                  (((BVar3 = prvTidynodeHasCM(node,2), BVar3 == no &&
                    (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) ||
                     (node->tag->id != TidyTag_NOFRAMES)))) &&
                   ((BVar3 = prvTidynodeHasCM(node,4), BVar3 == no ||
                    (((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) &&
                     (node->tag->id == TidyTag_TITLE)))))))))) {
                if ((iVar4 == 0) || (BVar3 = prvTidynodeHasCM(node,0x8000), BVar3 == no)) {
                  if ((bVar6) && (BVar3 = HasMixedContent(node), BVar3 == no)) {
                    PFlushLineSmart(doc,indent);
                  }
                  PPrintEndTag(doc,mode,indent,node);
                }
                else if ((iVar4 != 0) && ((doc->pprint).indent[0].spaces != indent)) {
                  (doc->pprint).indent[0].spaces = indent;
                }
              }
              else {
                PCondFlushLineSmart(doc,indent);
                if ((iVar4 == 0) || (BVar3 = prvTidynodeHasCM(node,0x8000), BVar3 == no)) {
                  PPrintEndTag(doc,mode,indent,node);
                }
              }
              if ((((bVar5) || (iVar4 != 0)) ||
                  ((node != (Node *)0x0 &&
                   ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_HTML)))))) || (bVar6)) {
                if (((bVar6) && (node->next != (Node *)0x0)) &&
                   (BVar3 = prvTidynodeHasCM(node,0xe8), BVar3 != no)) {
                  PFlushLineSmart(doc,indent);
                }
              }
              else {
                PFlushLineSmart(doc,indent);
              }
            }
            else if ((((int)(doc->config).value[0x30].v == 0) || (node == (Node *)0x0)) ||
                    ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_NOBR)))) {
              PPrintTag(doc,mode,indent,node);
              BVar3 = ShouldIndent(doc,node);
              if (BVar3 == no) {
                for (last = node->content; node_local._0_4_ = indent, last != (Node *)0x0;
                    last = last->next) {
                  prvTidyPPrintTree(doc,mode,indent,last);
                }
              }
              else {
                indent_00 = iVar2 + indent;
                PCondFlushLineSmart(doc,indent_00);
                for (last = node->content; last != (Node *)0x0; last = last->next) {
                  prvTidyPPrintTree(doc,mode,indent_00,last);
                }
                node_local._0_4_ = indent_00 - iVar2;
                PCondFlushLineSmart(doc,(uint)node_local);
              }
              PPrintEndTag(doc,mode,(uint)node_local,node);
            }
            else {
              for (last = node->content; last != (Node *)0x0; last = last->next) {
                prvTidyPPrintTree(doc,mode | 8,indent,last);
              }
            }
          }
          else {
            PPrintScriptStyle(doc,mode | 0x19,indent,node);
          }
        }
        else {
          uVar1 = (doc->config).value[0x57].v;
          PCondFlushLineSmart(doc,indent);
          if ((((int)uVar1 == 1) && (node->parent != (Node *)0x0)) &&
             (node->parent->content != node)) {
            PFlushLineSmart(doc,indent);
          }
          PPrintTag(doc,mode | 8,indent,node);
          for (last = node->content; last != (Node *)0x0; last = last->next) {
            prvTidyPPrintTree(doc,mode | 9,0,last);
          }
          PPrintEndTag(doc,mode,indent,node);
          if (((int)(doc->config).value[0x25].v == 0) && (node->next != (Node *)0x0)) {
            PFlushLineSmart(doc,indent);
          }
        }
      }
      else {
        BVar3 = prvTidynodeHasCM(node,0x10);
        if (BVar3 == no) {
          PCondFlushLineSmart(doc,indent);
        }
        if ((((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
            ((node->tag->id == TidyTag_BR && (node->prev != (Node *)0x0)))) &&
           ((((node->prev == (Node *)0x0 || (node->prev->tag == (Dict *)0x0)) ||
             (node->prev->tag->id != TidyTag_BR)) &&
            (((mode & 1) == 0 && ((int)(doc->config).value[7].v != 0)))))) {
          PFlushLineSmart(doc,indent);
        }
        if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
           ((node->tag->id == TidyTag_HR &&
            ((((int)(doc->config).value[0x57].v == 1 && (node->parent != (Node *)0x0)) &&
             (node->parent->content != node)))))) {
          PFlushLineSmart(doc,indent);
        }
        PPrintTag(doc,mode,indent,node);
        if (node->next != (Node *)0x0) {
          if ((((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
              (node->tag->id != TidyTag_PARAM)) &&
             (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) ||
              (node->tag->id != TidyTag_AREA)))) {
            if (((((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
                 (node->tag->id == TidyTag_BR)) && ((mode & 1) == 0)) ||
               (((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) &&
                (node->tag->id == TidyTag_HR)))) {
              PFlushLineSmart(doc,indent);
            }
          }
          else {
            PCondFlushLineSmart(doc,indent);
          }
        }
      }
    }
    else {
      PPrintMathML(doc,indent,node);
    }
  }
  return;
}

Assistant:

void TY_(PPrintTree)( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    Node *content, *last;
    uint spaces = cfg( doc, TidyIndentSpaces );
    Bool xhtml = cfgBool( doc, TidyXhtmlOut );

    if ( node == NULL )
        return;

    if (doc->progressCallback)
    {
        doc->progressCallback( tidyImplToDoc(doc), node->line, node->column, doc->pprint.line + 1 );
    }

#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_PPRINT)
    dbg_show_node( doc, node, 4, GetSpaces( &doc->pprint ) );
#endif

    if (node->type == TextNode)
    {
        PPrintText( doc, mode, indent, node );
    }
    else if ( node->type == CommentTag )
    {
        PPrintComment( doc, indent, node );
    }
    else if ( node->type == RootNode )
    {
        for ( content = node->content; content; content = content->next )
           TY_(PPrintTree)( doc, mode, indent, content );
    }
    else if ( node->type == DocTypeTag )
        PPrintDocType( doc, indent, node );
    else if ( node->type == ProcInsTag)
        PPrintPI( doc, indent, node );
    else if ( node->type == XmlDecl)
        PPrintXmlDecl( doc, indent, node );
    else if ( node->type == CDATATag)
        PPrintCDATA( doc, indent, node );
    else if ( node->type == SectionTag)
        PPrintSection( doc, indent, node );
    else if ( node->type == AspTag)
        PPrintAsp( doc, indent, node );
    else if ( node->type == JsteTag)
        PPrintJste( doc, indent, node );
    else if ( node->type == PhpTag)
        PPrintPhp( doc, indent, node );
    else if ( nodeIsMATHML(node) )
        PPrintMathML( doc, indent, node ); /* #130 MathML attr and entity fix! */
    else if ( TY_(nodeCMIsEmpty)(node) ||
              (node->type == StartEndTag && !xhtml) )
    {
        /* Issue #8 - flush to new line? 
           maybe use if ( TY_(nodeHasCM)(node, CM_BLOCK) ) instead
           or remove the CM_INLINE from the tag
         */
        if ( ! TY_(nodeHasCM)(node, CM_INLINE) )
            PCondFlushLineSmart( doc, indent );

        if ( nodeIsBR(node) && node->prev &&
             !(nodeIsBR(node->prev) || (mode & PREFORMATTED)) &&
             cfgBool(doc, TidyBreakBeforeBR) )
            PFlushLineSmart( doc, indent );

        if ( nodeIsHR(node) )
        {
            /* insert extra newline for classic formatting */
            Bool classic = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            if (classic && node->parent && node->parent->content != node)
            {
                PFlushLineSmart( doc, indent );
            }
        }

        PPrintTag( doc, mode, indent, node );

        if (node->next)
        {
          if (nodeIsPARAM(node) || nodeIsAREA(node))
              PCondFlushLineSmart(doc, indent);
          else if ((nodeIsBR(node) && !(mode & PREFORMATTED))
                   || nodeIsHR(node))
              PFlushLineSmart(doc, indent);
        }
    }
    else /* some kind of container element */
    {
        if ( node->type == StartEndTag )
            node->type = StartTag;

        if ( node->tag && 
             (node->tag->parser == TY_(ParsePre) || nodeIsTEXTAREA(node)) )
        {
            Bool classic  = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            uint indprev = indent;

            PCondFlushLineSmart( doc, indent ); /* about to add <pre> tag - clear any previous */

            /* insert extra newline for classic formatting */
            if (classic && node->parent && node->parent->content != node)
            {
                PFlushLineSmart( doc, indent );
            }

            /* Issue #697 - Add NOWRAP to the mode */
            PPrintTag( doc, (mode | NOWRAP), indent, node );   /* add <pre> or <textarea> tag */

            indent = 0;
            /* @camoy Fix #158 - remove inserted newlines in pre - PFlushLineSmart( doc, indent ); */

            for ( content = node->content; content; content = content->next )
            {
                TY_(PPrintTree)( doc, (mode | PREFORMATTED | NOWRAP),
                                 indent, content );
            }

            /* @camoy Fix #158 - remove inserted newlines in pre - PCondFlushLineSmart( doc, indent ); */
            indent = indprev;
            PPrintEndTag( doc, mode, indent, node );

            if ( cfgAutoBool(doc, TidyIndentContent) == TidyNoState
                 && node->next != NULL )
                PFlushLineSmart( doc, indent );
        }
        else if ( nodeIsSTYLE(node) || nodeIsSCRIPT(node) )
        {
            PPrintScriptStyle( doc, (mode | PREFORMATTED | NOWRAP | CDATA),
                               indent, node );
        }
        else if ( TY_(nodeCMIsInline)(node) )
        {
            if ( cfgBool(doc, TidyMakeClean) )
            {
                /* replace <nobr>...</nobr> by &nbsp; or &#160; etc. */
                if ( nodeIsNOBR(node) )
                {
                    for ( content = node->content;
                          content != NULL;
                          content = content->next)
                        TY_(PPrintTree)( doc, mode|NOWRAP, indent, content );
                    return;
                }
            }

            /* otherwise a normal inline element */
            PPrintTag( doc, mode, indent, node );

            /* indent content for SELECT, TEXTAREA, MAP, OBJECT and APPLET */
            if ( ShouldIndent(doc, node) )
            {
                indent += spaces;
                PCondFlushLineSmart( doc, indent );

                for ( content = node->content;
                      content != NULL;
                      content = content->next )
                    TY_(PPrintTree)( doc, mode, indent, content );

                indent -= spaces;
                PCondFlushLineSmart( doc, indent );
                /* PCondFlushLine( doc, indent ); */
            }
            else
            {
                for ( content = node->content;
                      content != NULL;
                      content = content->next )
                    TY_(PPrintTree)( doc, mode, indent, content );
            }
            PPrintEndTag( doc, mode, indent, node );
        }
        else /* other tags */
        {
            Bool indcont  = ( cfgAutoBool(doc, TidyIndentContent) != TidyNoState );
            /* Issue #582 - Seems this is no longer used
               Bool indsmart = ( cfgAutoBool(doc, TidyIndentContent) == TidyAutoState ); */
            Bool hideend  = cfgBool( doc, TidyOmitOptionalTags );
            Bool classic  = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            uint contentIndent = indent;

            /* insert extra newline for classic formatting */
            if (classic && node->parent && node->parent->content != node && !nodeIsHTML(node))
            {
                PFlushLineSmart( doc, indent );
            }

            if ( ShouldIndent(doc, node) )
                contentIndent += spaces;

            PCondFlushLineSmart( doc, indent );

            /*\
             *  Issue #180 - with the above PCondFlushLine, 
             *  this adds an unnecessary additional line!
             *  Maybe only if 'classic' ie --vertical-space yes 
             *  Issue #582 - maybe this is no longer needed!
             *  It adds a 3rd newline if indent: auto...
             *  if ( indsmart && node->prev != NULL && classic)
             *   PFlushLineSmart( doc, indent );
            \*/

            /* do not omit elements with attributes */
            if ( !hideend || !TY_(nodeHasCM)(node, CM_OMITST) ||
                 node->attributes != NULL )
            {
                PPrintTag( doc, mode, indent, node );

                if ( ShouldIndent(doc, node) )
                {
                    /* fix for bug 530791, don't wrap after */
                    /* <li> if first child is text node     */
                    if (!(nodeIsLI(node) && TY_(nodeIsText)(node->content)))
                        PCondFlushLineSmart( doc, contentIndent );
                }
                else if ( TY_(nodeHasCM)(node, CM_HTML) || nodeIsNOFRAMES(node) ||
                          (TY_(nodeHasCM)(node, CM_HEAD) && !nodeIsTITLE(node)) )
                    PFlushLineSmart( doc, contentIndent );
            }
            else if ( ShouldIndent(doc, node) )
            {
                /*\
                 * Issue #180 - If the tag was NOT printed due to the -omit option,
                 * then reduce the bumped indent under the same ShouldIndent(doc, node) 
                 * conditions that caused the indent to be bumped.
                \*/
                contentIndent -= spaces;
            }

            last = NULL;
            for ( content = node->content; content; content = content->next )
            {
                /* kludge for naked text before block level tag */
                if ( last && !indcont && TY_(nodeIsText)(last) &&
                     content->tag && !TY_(nodeHasCM)(content, CM_INLINE) )
                {
                    /* TY_(PFlushLine)(fout, indent); */
                    PFlushLineSmart( doc, contentIndent );
                }

                TY_(PPrintTree)( doc, mode, contentIndent, content );
                last = content;
            }

            /* don't flush line for td and th */
            if ( ShouldIndent(doc, node) ||
                 ( !hideend &&
                   ( TY_(nodeHasCM)(node, CM_HTML) || 
                     nodeIsNOFRAMES(node) ||
                     (TY_(nodeHasCM)(node, CM_HEAD) && !nodeIsTITLE(node))
                   )
                 )
               )
            {
                PCondFlushLineSmart( doc, indent );
                if ( !hideend || !TY_(nodeHasCM)(node, CM_OPT) )
                {
                    PPrintEndTag( doc, mode, indent, node );
                    /* TY_(PFlushLine)( doc, indent ); */
                }
            }
            else
            {
                if ( !hideend || !TY_(nodeHasCM)(node, CM_OPT) )
                {
                    /* newline before endtag for classic formatting */
                    if ( classic && !HasMixedContent(node) )
                        PFlushLineSmart( doc, indent );
                    PPrintEndTag( doc, mode, indent, node );
                }
                else if (hideend)
                {
                    /* Issue #390  - must still deal with adjusting indent */
                    TidyPrintImpl* pprint = &doc->pprint;
                    if (pprint->indent[ 0 ].spaces != (int)indent)
                    {
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_INDENT)
                        SPRTF("%s Indent from %d to %d\n", __FUNCTION__, pprint->indent[ 0 ].spaces, indent );
#endif  
                        pprint->indent[ 0 ].spaces = indent;
                    }
                }
            }

            if (!indcont && !hideend && !nodeIsHTML(node) && !classic)
                PFlushLineSmart( doc, indent );
            else if (classic && node->next != NULL && TY_(nodeHasCM)(node, CM_LIST|CM_DEFLIST|CM_TABLE|CM_BLOCK/*|CM_HEADING*/))
                PFlushLineSmart( doc, indent );
        }
    }
}